

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RelativeDateFormat::format
          (RelativeDateFormat *this,Calendar *cal,UnicodeString *appendTo,FieldPosition *pos)

{
  char cVar1;
  UBool UVar2;
  uint uVar3;
  int32_t day;
  undefined4 uVar4;
  UChar32 c;
  UChar *srcChars;
  uint uVar5;
  UnicodeString *this_00;
  UErrorCode status;
  int32_t len;
  FieldPosition *local_168;
  ConstChar16Ptr local_160;
  ConstChar16Ptr local_158;
  char16_t *local_150;
  char16_t *local_148;
  UnicodeString relativeDayString;
  UnicodeString combinedPattern;
  UnicodeString datePattern;
  UnicodeString local_70;
  
  status = U_ZERO_ERROR;
  relativeDayString.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_00471e80;
  relativeDayString.fUnion.fStackFields.fLengthAndFlags = 2;
  local_168 = pos;
  uVar3 = (*(this->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x1a])(this,1);
  day = dayDifference(cal,&status);
  len = 0;
  srcChars = getStringForDay(this,day,&len,&status);
  if ((srcChars != (UChar *)0x0) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
    icu_63::UnicodeString::setTo(&relativeDayString,srcChars,len);
  }
  uVar4 = relativeDayString.fUnion.fFields.fLength;
  if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
    uVar4 = (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  uVar5 = uVar3;
  if (((0 < (int)uVar4) && (0x1f < (ushort)(this->fDatePattern).fUnion.fStackFields.fLengthAndFlags)
      ) && (((ushort)(this->fTimePattern).fUnion.fStackFields.fLengthAndFlags < 0x20 ||
            ((this->fCombinedFormat == (SimpleFormatter *)0x0 ||
             (this->fCombinedHasDateAtStart != '\0')))))) {
    c = icu_63::UnicodeString::char32At(&relativeDayString,0);
    UVar2 = u_islower_63(c);
    uVar5 = 0x100;
    if ((UVar2 != '\0') && (this->fCapitalizationBrkIter != (BreakIterator *)0x0)) {
      if (uVar3 != 0x102) {
        if (uVar3 == 0x104) {
          cVar1 = this->fCapitalizationOfRelativeUnitsForStandAlone;
        }
        else {
          if (uVar3 != 0x103) goto LAB_002e5f65;
          cVar1 = this->fCapitalizationOfRelativeUnitsForUIListMenu;
        }
        if (cVar1 == '\0') goto LAB_002e5f65;
      }
      icu_63::UnicodeString::toTitle
                (&relativeDayString,this->fCapitalizationBrkIter,&this->fLocale,0x300);
    }
  }
LAB_002e5f65:
  (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x19])
            (this->fDateTimeFormatter,(ulong)uVar5,&status);
  if ((ushort)(this->fDatePattern).fUnion.fStackFields.fLengthAndFlags < 0x20) {
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
              (this->fDateTimeFormatter,&this->fTimePattern);
  }
  else {
    this_00 = &this->fDatePattern;
    if ((0x1f < (ushort)(this->fTimePattern).fUnion.fStackFields.fLengthAndFlags) &&
       (this->fCombinedFormat != (SimpleFormatter *)0x0)) {
      datePattern.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_00471e80;
      datePattern.fUnion.fStackFields.fLengthAndFlags = 2;
      if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
        relativeDayString.fUnion.fFields.fLength =
             (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (0 < relativeDayString.fUnion.fFields.fLength) {
        local_158.p_ = L"\'";
        icu_63::UnicodeString::UnicodeString(&combinedPattern,'\x01',&local_158,1);
        local_160.p_ = L"\'\'";
        icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_160,2);
        icu_63::UnicodeString::findAndReplace(&relativeDayString,&combinedPattern,&local_70);
        icu_63::UnicodeString::~UnicodeString(&local_70);
        local_148 = local_160.p_;
        icu_63::UnicodeString::~UnicodeString(&combinedPattern);
        local_150 = local_158.p_;
        this_00 = &relativeDayString;
        icu_63::UnicodeString::insert(this_00,0,L'\'');
        icu_63::UnicodeString::append(this_00,L'\'');
      }
      icu_63::UnicodeString::setTo(&datePattern,this_00);
      combinedPattern.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_00471e80;
      combinedPattern.fUnion.fStackFields.fLengthAndFlags = 2;
      SimpleFormatter::format
                (this->fCombinedFormat,&this->fTimePattern,&datePattern,&combinedPattern,&status);
      (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
                (this->fDateTimeFormatter,&combinedPattern);
      (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
                (this->fDateTimeFormatter,cal,appendTo,local_168);
      icu_63::UnicodeString::~UnicodeString(&combinedPattern);
      icu_63::UnicodeString::~UnicodeString(&datePattern);
      goto LAB_002e6043;
    }
    if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
      relativeDayString.fUnion.fFields.fLength =
           (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (0 < relativeDayString.fUnion.fFields.fLength) {
      icu_63::UnicodeString::append(appendTo,&relativeDayString);
      goto LAB_002e6043;
    }
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
              (this->fDateTimeFormatter,this_00);
  }
  (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
            (this->fDateTimeFormatter,cal,appendTo,local_168);
LAB_002e6043:
  icu_63::UnicodeString::~UnicodeString(&relativeDayString);
  return appendTo;
}

Assistant:

UnicodeString& RelativeDateFormat::format(  Calendar& cal,
                                UnicodeString& appendTo,
                                FieldPosition& pos) const {
                                
    UErrorCode status = U_ZERO_ERROR;
    UnicodeString relativeDayString;
    UDisplayContext capitalizationContext = getContext(UDISPCTX_TYPE_CAPITALIZATION, status);
    
    // calculate the difference, in days, between 'cal' and now.
    int dayDiff = dayDifference(cal, status);

    // look up string
    int32_t len = 0;
    const UChar *theString = getStringForDay(dayDiff, len, status);
    if(U_SUCCESS(status) && (theString!=NULL)) {
        // found a relative string
        relativeDayString.setTo(theString, len);
    }

    if ( relativeDayString.length() > 0 && !fDatePattern.isEmpty() && 
         (fTimePattern.isEmpty() || fCombinedFormat == NULL || fCombinedHasDateAtStart)) {
#if !UCONFIG_NO_BREAK_ITERATION
        // capitalize relativeDayString according to context for relative, set formatter no context
        if ( u_islower(relativeDayString.char32At(0)) && fCapitalizationBrkIter!= NULL &&
             ( capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
               (capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && fCapitalizationOfRelativeUnitsForUIListMenu) ||
               (capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_STANDALONE && fCapitalizationOfRelativeUnitsForStandAlone) ) ) {
            // titlecase first word of relativeDayString
            relativeDayString.toTitle(fCapitalizationBrkIter, fLocale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
        }
#endif
        fDateTimeFormatter->setContext(UDISPCTX_CAPITALIZATION_NONE, status);
    } else {
        // set our context for the formatter
        fDateTimeFormatter->setContext(capitalizationContext, status);
    }

    if (fDatePattern.isEmpty()) {
        fDateTimeFormatter->applyPattern(fTimePattern);
        fDateTimeFormatter->format(cal,appendTo,pos);
    } else if (fTimePattern.isEmpty() || fCombinedFormat == NULL) {
        if (relativeDayString.length() > 0) {
            appendTo.append(relativeDayString);
        } else {
            fDateTimeFormatter->applyPattern(fDatePattern);
            fDateTimeFormatter->format(cal,appendTo,pos);
        }
    } else {
        UnicodeString datePattern;
        if (relativeDayString.length() > 0) {
            // Need to quote the relativeDayString to make it a legal date pattern
            relativeDayString.findAndReplace(UNICODE_STRING("'", 1), UNICODE_STRING("''", 2)); // double any existing APOSTROPHE
            relativeDayString.insert(0, APOSTROPHE); // add APOSTROPHE at beginning...
            relativeDayString.append(APOSTROPHE); // and at end
            datePattern.setTo(relativeDayString);
        } else {
            datePattern.setTo(fDatePattern);
        }
        UnicodeString combinedPattern;
        fCombinedFormat->format(fTimePattern, datePattern, combinedPattern, status);
        fDateTimeFormatter->applyPattern(combinedPattern);
        fDateTimeFormatter->format(cal,appendTo,pos);
    }

    return appendTo;
}